

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_short)>::InvokeWith
          (FunctionMockerBase<void_(unsigned_short,_unsigned_short)> *this,type args)

{
  UntypedActionResultHolderBase *pUVar1;
  long lVar2;
  bool bVar3;
  GTestLog local_c;
  
  pUVar1 = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args)
  ;
  if (pUVar1 == (UntypedActionResultHolderBase *)0x0) {
    bVar3 = true;
  }
  else {
    lVar2 = __dynamic_cast(pUVar1,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<void>::typeinfo,0);
    bVar3 = lVar2 != 0;
  }
  bVar3 = IsTrue(bVar3);
  if (!bVar3) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ea);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition f == NULL || dynamic_cast<To>(f) != NULL failed. ",
               0x3b);
    GTestLog::~GTestLog(&local_c);
  }
  if (pUVar1 != (UntypedActionResultHolderBase *)0x0) {
    bVar3 = IsTrue(true);
    if (bVar3) {
      (*pUVar1->_vptr_UntypedActionResultHolderBase[1])(pUVar1);
    }
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }